

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O2

void __thiscall BibIndexer::publishErrors(BibIndexer *this)

{
  pointer pBVar1;
  pointer pBVar2;
  BibEntryIssue issue;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_100;
  BibEntryIssue local_c0;
  Stack<rapidjson::CrtAllocator> local_58;
  
  local_100.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58;
  local_58.stack_ = (char *)0x0;
  local_58.stackTop_ = (char *)0x0;
  local_58.stackEnd_ = (char *)0x0;
  local_58.allocator_ = (CrtAllocator *)0x0;
  local_58.ownAllocator_ = (CrtAllocator *)0x0;
  local_58.initialCapacity_ = 0x100;
  local_100.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_100.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_100.level_stack_.stackEnd_ = (char *)0x0;
  local_100.level_stack_.stack_ = (char *)0x0;
  local_100.level_stack_.stackTop_ = (char *)0x0;
  local_100.level_stack_.initialCapacity_ = 0x200;
  local_100.maxDecimalPlaces_ = 0x144;
  local_100.hasRoot_ = false;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_100);
  local_c0.super_Reflectable._vptr_Reflectable = (_func_int **)0x18213c;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_100,(Ch **)&local_c0);
  local_c0.super_Reflectable._vptr_Reflectable = (_func_int **)0x1cc3f4;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_100,(Ch **)&local_c0);
  local_c0.super_Reflectable._vptr_Reflectable = (_func_int **)0x182144;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_100,(Ch **)&local_c0);
  local_c0.super_Reflectable._vptr_Reflectable = (_func_int **)0x1d47a0;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_100,(Ch **)&local_c0);
  local_c0.super_Reflectable._vptr_Reflectable = (_func_int **)0x1d5adb;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_100,(Ch **)&local_c0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_100);
  local_c0.super_Reflectable._vptr_Reflectable = (_func_int **)0x1d3c5b;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_100,(Ch **)&local_c0);
  File::getPath_abi_cxx11_((string *)&local_c0,this->file);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0
          );
  std::__cxx11::string::~string((string *)&local_c0);
  local_c0.super_Reflectable._vptr_Reflectable = (_func_int **)0x1d47c0;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_100,(Ch **)&local_c0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(&local_100);
  pBVar1 = (this->issues).super__Vector_base<BibEntryIssue,_std::allocator<BibEntryIssue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar2 = (this->issues).super__Vector_base<BibEntryIssue,_std::allocator<BibEntryIssue>_>.
                _M_impl.super__Vector_impl_data._M_start; pBVar2 != pBVar1; pBVar2 = pBVar2 + 1) {
    BibEntryIssue::BibEntryIssue(&local_c0,pBVar2);
    BibEntryIssue::reflect(&local_c0,&local_100);
    BibEntryIssue::~BibEntryIssue(&local_c0);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(&local_100,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_100,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_100,0);
  sendMessage((StringBuffer *)&local_58);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_100.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_58);
  return;
}

Assistant:

void BibIndexer::publishErrors () {
    INIT_WRITER

    ADD_METHOD("textDocument/publishDiagnostics");

    writer.Key("params"); writer.StartObject();
        writer.Key("uri"); writer.String(file->getPath());
        writer.Key("diagnostics"); writer.StartArray();
            for (auto issue : issues) {
                issue.reflect(writer);
            }
        writer.EndArray();
    writer.EndObject();

    SEND_MESSAGE
}